

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniformxx.hpp
# Opt level: O0

ret_t trng::utility::u01xx_traits<double,_1UL,_trng::lagfib2xor<unsigned_long,_9842U,_19937U>_>::
      addin(lagfib2xor<unsigned_long,_9842U,_19937U> *r)

{
  result_type rVar1;
  result_type rVar2;
  result_type x;
  lagfib2xor<unsigned_long,_9842U,_19937U> *in_stack_fffffffffffffff0;
  
  rVar1 = lagfib2xor<unsigned_long,_9842U,_19937U>::operator()(in_stack_fffffffffffffff0);
  rVar2 = lagfib2xor<unsigned_long,_9842U,_19937U>::min();
  return (double)(rVar1 - rVar2 >> 1);
}

Assistant:

TRNG_CUDA_ENABLE
      static ret_t addin(prng_t &r) {
        const result_type x{r() - prng_t::min()};
        if (int_ok)
          return static_cast<ret_t>(static_cast<int>(x));
        else if (long_ok)
          return static_cast<ret_t>(static_cast<long>(x));
        else if (long_long_ok)
          return static_cast<ret_t>(static_cast<long long>(x));
        else if (use_ll_of_shifted)
          return static_cast<ret_t>(static_cast<long long>(x >> 1));
        else
          return static_cast<ret_t>(x);
      }